

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::copyTo
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *copy)

{
  int i;
  long lVar1;
  long lVar2;
  
  vec<Glucose::vec<unsigned_int>_>::growTo(&copy->occs,(this->occs).sz);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < (this->occs).sz; lVar1 = lVar1 + 1) {
    vec<unsigned_int>::memCopyTo
              ((vec<unsigned_int> *)((long)&((this->occs).data)->data + lVar2),
               (vec<unsigned_int> *)((long)&((copy->occs).data)->data + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  vec<char>::memCopyTo(&this->dirty,&copy->dirty);
  vec<int>::memCopyTo(&this->dirties,&copy->dirties);
  return;
}

Assistant:

void copyTo(OccLists &copy) const {
	
	copy.occs.growTo(occs.size());
	for(int i = 0;i<occs.size();i++)
	    occs[i].memCopyTo(copy.occs[i]);
	dirty.memCopyTo(copy.dirty);
	dirties.memCopyTo(copy.dirties);
    }